

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

char * build_pathname(archive_string *as,file_info *file,int depth)

{
  file_info *file_00;
  char *pcVar1;
  
  if (1000 < depth) {
    return (char *)0x0;
  }
  file_00 = file->parent;
  if ((file_00 != (file_info *)0x0) && ((file_00->name).length != 0)) {
    pcVar1 = build_pathname(as,file_00,depth + 1);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    archive_strcat(as,"/");
  }
  if ((file->name).length == 0) {
    archive_strcat(as,".");
  }
  else {
    archive_string_concat(as,&file->name);
  }
  return as->s;
}

Assistant:

static const char *
build_pathname(struct archive_string *as, struct file_info *file, int depth)
{
	// Plain ISO9660 only allows 8 dir levels; if we get
	// to 1000, then something is very, very wrong.
	if (depth > 1000) {
		return NULL;
	}
	if (file->parent != NULL && archive_strlen(&file->parent->name) > 0) {
		if (build_pathname(as, file->parent, depth + 1) == NULL) {
			return NULL;
		}
		archive_strcat(as, "/");
	}
	if (archive_strlen(&file->name) == 0)
		archive_strcat(as, ".");
	else
		archive_string_concat(as, &file->name);
	return (as->s);
}